

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int root_recv_buffer(int sock,int *op,char *buffer,int buflen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char recbuf [1200];
  uint local_4ec;
  undefined1 local_4e8 [1208];
  
  iVar1 = NET_RecvRaw(sock,&local_4ec,4);
  if (iVar1 < 0) {
    return iVar1;
  }
  local_4ec = (local_4ec >> 0x18 | (local_4ec & 0xff0000) >> 8 | (local_4ec & 0xff00) << 8 |
              local_4ec << 0x18) - 4;
  iVar2 = NET_RecvRaw(sock,op,4);
  if (iVar2 < 0) {
    return iVar2;
  }
  uVar4 = *op;
  *op = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  if ((int)local_4ec < 0x4b1) {
    iVar3 = iVar2;
    if ((int)local_4ec < 1) goto LAB_00138aeb;
  }
  else {
    local_4ec = 0x4b0;
  }
  iVar3 = NET_RecvRaw(sock,local_4e8,local_4ec);
  uVar4 = 4;
  if ((int)local_4ec < 4) {
    uVar4 = local_4ec;
  }
  memcpy(buffer,local_4e8,(long)(int)uVar4);
  if (iVar3 < 0) {
    return iVar3;
  }
LAB_00138aeb:
  return iVar3 + iVar2 + iVar1;
}

Assistant:

static int root_recv_buffer(int sock, int *op, char *buffer, int buflen)
{
  /* recv a buffer, the form is
     <len>
     <op>
     <buffer>
  */

  int recv1 = 0;
  int len;
  int status;
  char recbuf[MAXLEN];

  status = NET_RecvRaw(sock,&len,4);

  if (status < 0) {
    return status;
  }
  recv1 += status;

  len = ntohl(len);

  /* ok, have the length, recive the operation */
  len -= 4;
  status = NET_RecvRaw(sock,op,4);
  if (status < 0) {
    return status;
  }

  recv1 += status;

  *op = ntohl(*op);
  
  if (len > MAXLEN) {
    len = MAXLEN;
  }

  if (len > 0) { /* Get the rest of the message */
    status = NET_RecvRaw(sock,recbuf,len);
    if (len > buflen) {
      len = buflen;
    }
    memcpy(buffer,recbuf,len);
    if (status < 0) {
      return status;
    }
  } 

  recv1 += status;
  return recv1;

}